

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O2

vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> * __thiscall
Indexer::created_dataset_ptrs
          (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
           *__return_storage_ptr__,Indexer *this)

{
  pointer puVar1;
  unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *p;
  pointer puVar2;
  _Head_base<0UL,_OnDiskDataset_*,_false> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (this->created_datasets).
           super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->created_datasets).
                super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_28._M_head_impl =
         (puVar2->_M_t).super___uniq_ptr_impl<OnDiskDataset,_std::default_delete<OnDiskDataset>_>.
         _M_t.super__Tuple_impl<0UL,_OnDiskDataset_*,_std::default_delete<OnDiskDataset>_>.
         super__Head_base<0UL,_OnDiskDataset_*,_false>._M_head_impl;
    std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
    emplace_back<OnDiskDataset_const*>
              ((vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)
               __return_storage_ptr__,&local_28._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const OnDiskDataset *> Indexer::created_dataset_ptrs() {
    std::vector<const OnDiskDataset *> ptrs;

    for (auto &p : created_datasets) {
        ptrs.push_back(p.get());
    }

    return ptrs;
}